

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateAttribute
          (HtmlparserCppTest *this,string *expected_attr)

{
  HtmlParser *source;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  HtmlparserCppTest *pHVar6;
  HtmlparserCppTest *pHVar7;
  HtmlparserCppTest *pHVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  HtmlparserCppTest *pHVar9;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar10;
  HtmlParser *this_00;
  const_iterator cVar11;
  mapped_type *ppHVar12;
  undefined8 extraout_RAX_02;
  undefined7 uVar13;
  ulong uVar14;
  htmlparser_ctx *phVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  HtmlparserCppTest *pHVar18;
  HtmlparserCppTest *pHVar19;
  htmlparser_ctx_s *phVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  pointer this_01;
  _Base_ptr unaff_R12;
  pointer str_00;
  _Base_ptr unaff_R15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_1f8;
  HtmlparserCppTest *pHStack_1e0;
  _Base_ptr p_Stack_1d8;
  undefined1 auStack_198 [16];
  _Base_ptr p_Stack_188;
  HtmlparserCppTest *pHStack_180;
  _Base_ptr p_Stack_178;
  undefined1 auStack_170 [16];
  _Base_ptr p_Stack_160;
  HtmlparserCppTest *pHStack_158;
  _Base_ptr p_Stack_150;
  char *pcStack_148;
  HtmlParser HStack_140;
  allocator aStack_101;
  HtmlparserCppTest *pHStack_100;
  size_t sStack_f8;
  HtmlparserCppTest HStack_f0;
  HtmlparserCppTest *pHStack_b0;
  ulong uStack_a8;
  HtmlparserCppTest *pHStack_98;
  allocator aStack_81;
  HtmlparserCppTest *pHStack_80;
  size_t sStack_78;
  undefined1 auStack_70 [40];
  HtmlparserCppTest *pHStack_48;
  HtmlParser HStack_40;
  _Base_ptr p_Stack_28;
  HtmlparserCppTest *pHStack_20;
  
  pHVar9 = (HtmlparserCppTest *)(this->parser_).parser_;
  pHStack_20 = (HtmlparserCppTest *)0x107027;
  pHVar6 = (HtmlparserCppTest *)expected_attr;
  lVar5 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)pHVar9);
  if (lVar5 == 0) {
    pHStack_20 = (HtmlparserCppTest *)0x107051;
    ValidateAttribute();
  }
  else {
    pHStack_20 = (HtmlparserCppTest *)0x107035;
    pHVar6 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_attr((this->parser_).parser_);
    pHStack_20 = (HtmlparserCppTest *)0x107040;
    pHVar9 = (HtmlparserCppTest *)expected_attr;
    iVar4 = std::__cxx11::string::compare((char *)expected_attr);
    if (iVar4 == 0) {
      return;
    }
  }
  pHStack_20 = (HtmlparserCppTest *)ValidateValue;
  ValidateAttribute();
  pHVar8 = (HtmlparserCppTest *)(pHVar9->parser_).parser_;
  auStack_70._24_8_ = (_Base_ptr)0x10706c;
  pHVar7 = pHVar6;
  p_Stack_28 = (_Base_ptr)expected_attr;
  pHStack_20 = this;
  lVar5 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar8);
  if (lVar5 != 0) {
    auStack_70._24_8_ = (_Base_ptr)0x10707a;
    pHVar7 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_value((pHVar9->parser_).parser_);
    auStack_70._24_8_ = (_Base_ptr)0x10708f;
    pHVar8 = (HtmlparserCppTest *)&pHStack_48;
    std::__cxx11::string::string
              ((string *)&pHStack_48,(char *)pHVar7,(allocator *)(auStack_70 + 0x27));
    phVar15 = *(htmlparser_ctx **)&(pHVar6->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header
    ;
    pHVar9 = (HtmlparserCppTest *)&pHStack_48;
    if (phVar15 == HStack_40.parser_) {
      if (phVar15 == (htmlparser_ctx *)0x0) {
LAB_001070b2:
        if (pHStack_48 != (HtmlparserCppTest *)&stack0xffffffffffffffc8) {
          auStack_70._24_8_ = (_Base_ptr)0x1070c4;
          operator_delete(pHStack_48);
        }
        return;
      }
      pHVar8 = *(HtmlparserCppTest **)&(pHVar6->contextMap)._M_t._M_impl;
      auStack_70._24_8_ = (_Base_ptr)0x1070ae;
      pHVar7 = pHStack_48;
      iVar4 = bcmp(pHVar8,pHStack_48,(size_t)phVar15);
      pHVar9 = pHStack_48;
      if (iVar4 == 0) goto LAB_001070b2;
    }
    auStack_70._24_8_ = (_Base_ptr)0x1070d1;
    ValidateValue();
  }
  auStack_70._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_70._24_8_ = pHVar9;
  auStack_70._16_8_ = pHVar6;
  pHVar6 = (HtmlparserCppTest *)(pHVar8->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar6);
  puVar16 = kAttributeTypeMap;
  pHVar8 = (HtmlparserCppTest *)IdToName(pHVar6,(IdNameMap *)kAttributeTypeMap,iVar4);
  if (*(long *)&(pHVar7->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
    ValidateAttributeType();
  }
  else {
    pHVar6 = (HtmlparserCppTest *)&pHStack_80;
    std::__cxx11::string::string((string *)pHVar6,(char *)pHVar8,&aStack_81);
    sVar2 = *(size_t *)&(pHVar7->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    puVar16 = (undefined1 *)pHVar8;
    if (sVar2 == sStack_78) {
      uVar13 = (undefined7)((ulong)pHVar7 >> 8);
      if (sVar2 == 0) {
        pHVar7 = (HtmlparserCppTest *)CONCAT71(uVar13,1);
      }
      else {
        pHVar6 = *(HtmlparserCppTest **)&(pHVar7->contextMap)._M_t._M_impl;
        puVar16 = (undefined1 *)pHStack_80;
        iVar4 = bcmp(pHVar6,pHStack_80,sVar2);
        pHVar7 = (HtmlparserCppTest *)CONCAT71(uVar13,iVar4 == 0);
      }
    }
    else {
      pHVar7 = (HtmlparserCppTest *)0x0;
    }
    if (pHStack_80 != (HtmlparserCppTest *)auStack_70) {
      pHVar6 = pHStack_80;
      operator_delete(pHStack_80);
    }
    pHVar9 = pHStack_80;
    if ((char)pHVar7 != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_a8 = 0x10717a;
  pHStack_98 = pHVar7;
  bVar3 = StringToBool((string *)puVar16);
  uVar14 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  phVar20 = (pHVar6->parser_).parser_;
  uStack_a8 = 0x107185;
  iVar4 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar20);
  if (SUB81(uVar14,0) == (iVar4 != 0)) {
    return;
  }
  uStack_a8 = 0x10719b;
  ValidateAttributeQuoted();
  HStack_f0.parser_.parser_ = (htmlparser_ctx *)0x1071aa;
  pHStack_b0 = pHVar6;
  uStack_a8 = uVar14;
  bVar3 = StringToBool((string *)puVar16);
  phVar15 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar3) & 0xffffffff);
  p_Var21 = *(_Base_ptr *)(phVar20 + 0x30);
  HStack_f0.parser_.parser_ = (htmlparser_ctx *)0x1071b5;
  iVar4 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var21);
  if (SUB81(phVar15,0) == (iVar4 != 0)) {
    return;
  }
  HStack_f0.parser_.parser_ = (htmlparser_ctx *)0x1071cb;
  ValidateInJavascript();
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071da;
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar20;
  HStack_f0.parser_.parser_ = phVar15;
  bVar3 = StringToBool((string *)puVar16);
  p_Var22 = p_Var21[1]._M_left;
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071e5;
  iVar4 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var22);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071fb;
  ValidateJavascriptQuoted();
  pHVar6 = (HtmlparserCppTest *)p_Var22[1]._M_left;
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var21;
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar9;
  iVar4 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar6);
  puVar17 = kJavascriptStateMap;
  pHVar8 = (HtmlparserCppTest *)IdToName(pHVar6,(IdNameMap *)kJavascriptStateMap,iVar4);
  if (*(long *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    pHVar6 = (HtmlparserCppTest *)&pHStack_100;
    std::__cxx11::string::string((string *)pHVar6,(char *)pHVar8,&aStack_101);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar17 = (undefined1 *)pHVar8;
    if (sVar2 == sStack_f8) {
      if (sVar2 == 0) {
        bVar3 = true;
      }
      else {
        pHVar6 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl;
        puVar17 = (undefined1 *)pHStack_100;
        iVar4 = bcmp(pHVar6,pHStack_100,sVar2);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (pHStack_100 != &HStack_f0) {
      pHVar6 = pHStack_100;
      operator_delete(pHStack_100);
    }
    pHVar9 = pHStack_100;
    if (bVar3) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar3 = StringToBool((string *)puVar17);
  pHVar8 = (HtmlparserCppTest *)(pHVar6->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)pHVar8);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar18 = (HtmlparserCppTest *)&pcStack_148;
  pHVar7 = pHVar8;
  HStack_140.parser_ = (htmlparser_ctx *)pHVar6;
  if (*(long *)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
LAB_00107324:
    pHVar18 = (HtmlparserCppTest *)puVar17;
    p_Stack_150 = (_Base_ptr)0x107329;
    ValidateLine();
  }
  else {
    p_Stack_150 = (_Base_ptr)0x1072dc;
    pcStack_148 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar7 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl;
    p_Stack_150 = (_Base_ptr)0x1072f8;
    pHVar9 = (HtmlparserCppTest *)strtol((char *)pHVar7,&pcStack_148,10);
    pHVar6 = pHVar8;
    puVar17 = (undefined1 *)pHVar18;
    unaff_R12 = (_Base_ptr)&pcStack_148;
    if ((*pcStack_148 != '\0') ||
       (unaff_R12 = (_Base_ptr)&pcStack_148, unaff_R15->_M_color != _S_red)) goto LAB_00107324;
    pHVar7 = (HtmlparserCppTest *)(pHVar8->parser_).parser_;
    p_Stack_150 = (_Base_ptr)0x107313;
    iVar4 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)pHVar7);
    unaff_R12 = (_Base_ptr)&pcStack_148;
    if (iVar4 == (int)pHVar9) {
      return;
    }
  }
  p_Stack_150 = (_Base_ptr)ValidateColumn;
  ValidateLine();
  pHVar19 = (HtmlparserCppTest *)auStack_170;
  pHVar8 = pHVar7;
  auStack_170._8_8_ = pHVar6;
  p_Stack_160 = unaff_R12;
  pHStack_158 = pHVar9;
  p_Stack_150 = unaff_R15;
  if (*(long *)&(pHVar18->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
LAB_00107390:
    pHVar19 = pHVar18;
    p_Stack_178 = (_Base_ptr)0x107395;
    ValidateColumn();
  }
  else {
    p_Stack_178 = (_Base_ptr)0x107348;
    auStack_170._0_8_ = extraout_RAX_00;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar8 = *(HtmlparserCppTest **)&(pHVar18->contextMap)._M_t._M_impl;
    p_Stack_178 = (_Base_ptr)0x107364;
    pHVar9 = (HtmlparserCppTest *)strtol((char *)pHVar8,(char **)auStack_170,10);
    pHVar6 = pHVar7;
    pHVar18 = pHVar19;
    unaff_R12 = (_Base_ptr)auStack_170;
    if ((*(char *)auStack_170._0_8_ != '\0') ||
       (unaff_R12 = (_Base_ptr)auStack_170, unaff_R15->_M_color != _S_red)) goto LAB_00107390;
    pHVar8 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
    p_Stack_178 = (_Base_ptr)0x10737f;
    iVar4 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)pHVar8);
    unaff_R12 = (_Base_ptr)auStack_170;
    if (iVar4 == (int)pHVar9) {
      return;
    }
  }
  p_Stack_178 = (_Base_ptr)ValidateValueIndex;
  ValidateColumn();
  pHVar18 = (HtmlparserCppTest *)auStack_198;
  pHVar7 = pHVar8;
  auStack_198._8_8_ = pHVar6;
  p_Stack_188 = unaff_R12;
  pHStack_180 = pHVar9;
  p_Stack_178 = unaff_R15;
  if (*(long *)&(pHVar19->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
    auStack_198._0_8_ = extraout_RAX_01;
    piVar10 = __errno_location();
    *piVar10 = 0;
    pHVar7 = *(HtmlparserCppTest **)&(pHVar19->contextMap)._M_t._M_impl;
    lVar5 = strtol((char *)pHVar7,(char **)auStack_198,10);
    pHVar19 = pHVar18;
    unaff_R12 = (_Base_ptr)auStack_198;
    if ((*(char *)auStack_198._0_8_ == '\0') && (unaff_R12 = (_Base_ptr)auStack_198, *piVar10 == 0))
    {
      pHVar7 = (HtmlparserCppTest *)(pHVar8->parser_).parser_;
      iVar4 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)pHVar7);
      unaff_R12 = (_Base_ptr)auStack_198;
      if (iVar4 == (int)lVar5) {
        return;
      }
      goto LAB_00107401;
    }
  }
  pHVar18 = pHVar19;
  ValidateValueIndex();
LAB_00107401:
  ValidateValueIndex();
  bVar3 = StringToBool((string *)pHVar18);
  pHVar9 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar9);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_1f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_1f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_1e0 = pHVar7;
  p_Stack_1d8 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)pHVar18,"=",",",&vStack_1f8);
  if (vStack_1f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_1f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    source = &pHVar9->parser_;
    p_Var1 = &(pHVar9->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_1f8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar4 = std::__cxx11::string::compare((char *)str_00);
      if (iVar4 == 0) {
        ValidateState(pHVar9,str);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)str_00);
        if (iVar4 == 0) {
          ValidateTag(pHVar9,str);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)str_00);
          if (iVar4 == 0) {
            ValidateAttribute(pHVar9,str);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)str_00);
            if (iVar4 == 0) {
              ValidateValue(pHVar9,str);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)str_00);
              if (iVar4 == 0) {
                ValidateAttributeType(pHVar9,str);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)str_00);
                if (iVar4 == 0) {
                  ValidateAttributeQuoted(pHVar9,str);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar4 == 0) {
                    ValidateInJavascript(pHVar9,str);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar4 == 0) {
                      ValidateJavascriptQuoted(pHVar9,str);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar4 == 0) {
                        ValidateJavascriptState(pHVar9,str);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar4 == 0) {
                          ValidateInCss(pHVar9,str);
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar4 == 0) {
                            ValidateLine(pHVar9,str);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar4 == 0) {
                              ValidateColumn(pHVar9,str);
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar4 == 0) {
                                ValidateValueIndex(pHVar9,str);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar4 == 0) {
                                  ValidateIsUrlStart(pHVar9,str);
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar4 == 0) {
                                    cVar11 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar9,str);
                                    if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar12 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar9->contextMap,str);
                                      *ppHVar12 = this_00;
                                    }
                                    ppHVar12 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar9->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar12,source);
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar4 == 0) {
                                      cVar11 = std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar9,str);
                                      if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_00107851:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_1f8);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar12 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar9->contextMap,str);
                                      HtmlParser::CopyFrom(source,*ppHVar12);
                                    }
                                    else {
                                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar4 == 0) {
                                        bVar3 = StringToBool(str);
                                        if (bVar3) {
                                          ctemplate_htmlparser::htmlparser_reset(source->parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar4 == 0) {
                                          iVar4 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    (source->parser_,iVar4);
                                        }
                                        else {
                                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar4 != 0) goto LAB_00107851;
                                          bVar3 = StringToBool(str);
                                          if (bVar3) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      (source->parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_1f8.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_1f8);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateAttribute(const string &expected_attr) {
  EXPECT_TRUE(parser_.attribute() != NULL);
  EXPECT_EQ(expected_attr, parser_.attribute())
      << "Unexpected attr name value at line " << parser_.line_number();
}